

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O0

void clear_memory(TRIPLEYCbCr **mrx,int h)

{
  int local_18;
  int i;
  int h_local;
  TRIPLEYCbCr **mrx_local;
  
  for (local_18 = 0; local_18 < h; local_18 = local_18 + 1) {
    if (mrx[local_18] != (TRIPLEYCbCr *)0x0) {
      operator_delete__(mrx[local_18]);
    }
  }
  if (mrx != (TRIPLEYCbCr **)0x0) {
    operator_delete__(mrx);
  }
  return;
}

Assistant:

void clear_memory(TRIPLEYCbCr **mrx, int h) {
    for (int i = 0; i < h; i++)
        delete[] mrx[i];
    delete[] mrx;
}